

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O3

void __thiscall logfault::LogManager::LogMessage(LogManager *this,Message *message)

{
  mutex *__mutex;
  pointer puVar1;
  Handler *pHVar2;
  int iVar3;
  undefined8 uVar4;
  unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_> *h;
  pointer puVar5;
  
  __mutex = &this->mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    puVar1 = (this->handlers_).
             super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (this->handlers_).
                  super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1)
    {
      pHVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<logfault::Handler,_std::default_delete<logfault::Handler>_>.
               _M_t.
               super__Tuple_impl<0UL,_logfault::Handler_*,_std::default_delete<logfault::Handler>_>.
               super__Head_base<0UL,_logfault::Handler_*,_false>._M_head_impl;
      if ((int)message->level_ <= (int)pHVar2->level_) {
        (*pHVar2->_vptr_Handler[2])(pHVar2,message);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

void LogMessage(Message message) {
            std::lock_guard<std::mutex> lock{mutex_};
            for(const auto& h : handlers_) {
                if (h->level_ >= message.level_) {
                    h->LogMessage(message);
                }
            }
        }